

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_select(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  int32_t iVar2;
  TRef TVar3;
  ulong uVar4;
  ulong uVar5;
  long in_RSI;
  TValue *in_RDI;
  TRef unaff_retaddr;
  ptrdiff_t i;
  ptrdiff_t n;
  ptrdiff_t start;
  TRef tr;
  RecordFFData *in_stack_ffffffffffffffc8;
  jit_State *in_stack_ffffffffffffffd0;
  long lVar6;
  undefined8 in_stack_ffffffffffffffd8;
  int32_t k;
  
  k = (int32_t)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar1 = *(uint *)in_RDI[0x11];
  if (uVar1 != 0) {
    iVar2 = lj_ffrecord_select_mode((jit_State *)i,unaff_retaddr,in_RDI);
    uVar4 = (ulong)iVar2;
    if (uVar4 == 0) {
      TVar3 = lj_ir_kint((jit_State *)0x0,k);
      *(TRef *)in_RDI[0x11] = TVar3;
    }
    else if ((uVar1 & 0xffff) < 0x8000) {
      uVar5 = (ulong)*(uint *)((long)in_RDI + 0x94);
      if ((long)uVar4 < 0) {
        uVar4 = uVar5 + uVar4;
      }
      else if ((long)uVar5 < (long)uVar4) {
        uVar4 = uVar5;
      }
      if (0 < (long)uVar4) {
        *(ulong *)(in_RSI + 8) = uVar5 - uVar4;
        for (lVar6 = 0; lVar6 < (long)(uVar5 - uVar4); lVar6 = lVar6 + 1) {
          *(undefined4 *)(in_RDI[0x11].u64 + lVar6 * 4) =
               *(undefined4 *)(in_RDI[0x11].u64 + (uVar4 + lVar6) * 4);
        }
      }
    }
    else {
      recff_nyi(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_select(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (tr) {
    ptrdiff_t start = lj_ffrecord_select_mode(J, tr, &rd->argv[0]);
    if (start == 0) {  /* select('#', ...) */
      J->base[0] = lj_ir_kint(J, J->maxslot - 1);
    } else if (tref_isk(tr)) {  /* select(k, ...) */
      ptrdiff_t n = (ptrdiff_t)J->maxslot;
      if (start < 0) start += n;
      else if (start > n) start = n;
      if (start >= 1) {
	ptrdiff_t i;
	rd->nres = n - start;
	for (i = 0; i < n - start; i++)
	  J->base[i] = J->base[start+i];
      }  /* else: Interpreter will throw. */
    } else {
      recff_nyiu(J, rd);
      return;
    }
  }  /* else: Interpreter will throw. */
}